

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

MemberIterator __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::MemberEnd
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this)

{
  uint *in_RSI;
  
  if (*(short *)((long)in_RSI + 0xe) == 3) {
    (this->data_).n = (Number)((ulong)*in_RSI * 0x20 + (*(ulong *)(in_RSI + 2) & 0xffffffffffff));
    return (MemberIterator)(Pointer)this;
  }
  __assert_fail("IsObject()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                ,0x4fd,
                "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::MemberEnd() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

bool IsObject() const { return data_.f.flags == kObjectFlag; }